

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::ConvertToolPrivate
          (ConvertToolPrivate *this,ConvertSettings *settings)

{
  this->m_settings = settings;
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ostream::ostream(&this->m_out,*(streambuf **)(puts + *(long *)(std::cout + -0x18)));
  return;
}

Assistant:

ConvertToolPrivate(ConvertTool::ConvertSettings* settings)
        : m_settings(settings)
        , m_out(std::cout.rdbuf())
    {}